

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v7::detail::
       parse_arg_id<char,fmt::v7::detail::id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&,char>&>
                 (char *begin,char *end,
                 id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
                 *handler)

{
  id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
  *this;
  char *s;
  bool bVar1;
  type count;
  bool local_4b;
  basic_string_view<char> local_48;
  id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
  *local_38;
  char *it;
  int index;
  char c;
  id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
  *handler_local;
  char *end_local;
  char *begin_local;
  
  _index = handler;
  handler_local =
       (id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
        *)end;
  end_local = begin;
  if (begin != end) {
    it._7_1_ = *begin;
    if ((it._7_1_ == '}') || (it._7_1_ == ':')) {
      id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
      ::operator()(handler);
      begin_local = end_local;
    }
    else if ((it._7_1_ < '0') || ('9' < it._7_1_)) {
      bVar1 = is_name_start<char>(it._7_1_);
      if (bVar1) {
        local_38 = (id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
                    *)end_local;
        do {
          local_38 = (id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
                      *)((long)&local_38->handler + 1);
          local_4b = false;
          if (local_38 != handler_local) {
            it._7_1_ = *(char *)&local_38->handler;
            bVar1 = is_name_start<char>(it._7_1_);
            local_4b = true;
            if (!bVar1) {
              local_4b = '/' < it._7_1_ && it._7_1_ < ':';
            }
          }
          s = end_local;
          this = _index;
        } while (local_4b);
        count = to_unsigned<long>((long)local_38 - (long)end_local);
        basic_string_view<char>::basic_string_view(&local_48,s,count);
        id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
        ::operator()(this,local_48);
        begin_local = (char *)local_38;
      }
      else {
        id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
        ::on_error(_index,"invalid format string");
        begin_local = end_local;
      }
    }
    else {
      it._0_4_ = 0;
      if (it._7_1_ == '0') {
        end_local = begin + 1;
      }
      else {
        it._0_4_ = parse_nonnegative_int<char,fmt::v7::detail::id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&,char>&>
                             (&end_local,end,handler);
      }
      if (((id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
            *)end_local == handler_local) || ((*end_local != '}' && (*end_local != ':')))) {
        id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
        ::on_error(_index,"invalid format string");
      }
      else {
        id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
        ::operator()(_index,(int)it);
      }
      begin_local = end_local;
    }
    return begin_local;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format.h"
              ,0xa8e,"");
}

Assistant:

FMT_CONSTEXPR const Char* parse_arg_id(const Char* begin, const Char* end,
                                       IDHandler&& handler) {
  FMT_ASSERT(begin != end, "");
  Char c = *begin;
  if (c == '}' || c == ':') {
    handler();
    return begin;
  }
  if (c >= '0' && c <= '9') {
    int index = 0;
    if (c != '0')
      index = parse_nonnegative_int(begin, end, handler);
    else
      ++begin;
    if (begin == end || (*begin != '}' && *begin != ':'))
      handler.on_error("invalid format string");
    else
      handler(index);
    return begin;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return begin;
  }
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}